

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O1

Vec_Ptr_t * Prs_CreateDetectRams(Prs_Ntk_t *pNtk)

{
  uint uVar1;
  int *piVar2;
  undefined4 uVar3;
  int NameRamId;
  int iVar4;
  int iVar5;
  char *__s1;
  char *pcVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  uint *puVar9;
  undefined8 *puVar10;
  void *pvVar11;
  Vec_Int_t *pVVar12;
  int *piVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  
  NameRamId = Abc_NamStrFind(pNtk->pStrs,"Ram");
  if ((pNtk->vObjs).nSize < 1) {
    pVVar7 = (Vec_Ptr_t *)0x0;
  }
  else {
    lVar17 = 0;
    pVVar7 = (Vec_Ptr_t *)0x0;
    do {
      piVar13 = (pNtk->vObjs).pArray;
      iVar4 = piVar13[lVar17];
      if (((long)iVar4 < 0) || (iVar5 = (pNtk->vBoxes).nSize, iVar5 <= iVar4)) {
LAB_00344085:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar2 = (pNtk->vBoxes).pArray;
      Prs_BoxSignals_V._0_4_ = piVar2[iVar4] + -2;
      iVar4 = piVar13[lVar17];
      Prs_BoxSignals_V._4_4_ = Prs_BoxSignals_V._0_4_;
      if ((iVar4 < -3) || (iVar5 <= (int)(iVar4 + 3U))) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      Prs_BoxSignals_V._8_8_ = piVar2 + (iVar4 + 3U);
      if (*(int *)Prs_BoxSignals_V._8_8_ != 0) {
        if ((iVar4 < -1) || (iVar5 <= (int)(iVar4 + 1U))) goto LAB_00344085;
        __s1 = Abc_NamStr(pNtk->pStrs,piVar2[iVar4 + 1U]);
        iVar4 = strncmp(__s1,"ClockedWritePort_",0x11);
        if ((iVar4 == 0) || (iVar5 = strncmp(__s1,"ReadPort_",9), iVar5 == 0)) {
          pcVar6 = Prs_CreateDetectRamPort(pNtk,(Vec_Int_t *)Prs_BoxSignals_V,NameRamId);
          if (pcVar6 == (char *)0x0) {
            __assert_fail("pRamName",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaReadVer.c"
                          ,0x6d6,"Vec_Ptr_t *Prs_CreateDetectRams(Prs_Ntk_t *)");
          }
          if (pVVar7 == (Vec_Ptr_t *)0x0) {
            pVVar7 = (Vec_Ptr_t *)malloc(0x10);
            pVVar7->nCap = 8;
            pVVar7->nSize = 0;
            ppvVar8 = (void **)malloc(0x40);
            pVVar7->pArray = ppvVar8;
          }
          uVar1 = pVVar7->nSize;
          if ((int)uVar1 < 1) {
            iVar5 = 0;
          }
          else {
            uVar16 = 0;
            do {
              puVar9 = (uint *)pVVar7->pArray[uVar16];
              if ((int)puVar9[1] < 1) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              if (pcVar6 == (char *)**(long **)(puVar9 + 2)) {
                if (iVar4 == 0) {
                  pVVar12 = (Vec_Int_t *)malloc(0x10);
                  uVar3 = Prs_BoxSignals_V._4_4_;
                  lVar14 = (long)(int)Prs_BoxSignals_V._4_4_;
                  pVVar12->nSize = Prs_BoxSignals_V._4_4_;
                  pVVar12->nCap = uVar3;
                  if (lVar14 == 0) {
                    piVar13 = (int *)0x0;
                  }
                  else {
                    piVar13 = (int *)malloc(lVar14 * 4);
                  }
                  pVVar12->pArray = piVar13;
                  memcpy(piVar13,(void *)Prs_BoxSignals_V._8_8_,lVar14 << 2);
                  Vec_IntPush(pVVar12,(int)lVar17);
                  uVar1 = *puVar9;
                  if (puVar9[1] == uVar1) {
                    if ((int)uVar1 < 0x10) {
                      if (*(void **)(puVar9 + 2) == (void *)0x0) {
                        pvVar11 = malloc(0x80);
                      }
                      else {
                        pvVar11 = realloc(*(void **)(puVar9 + 2),0x80);
                      }
                      uVar15 = 0x10;
                    }
                    else {
                      uVar15 = uVar1 * 2;
                      if ((int)uVar15 <= (int)uVar1) goto LAB_00343de7;
                      if (*(void **)(puVar9 + 2) == (void *)0x0) {
                        pvVar11 = malloc((ulong)uVar1 << 4);
                      }
                      else {
                        pvVar11 = realloc(*(void **)(puVar9 + 2),(ulong)uVar1 << 4);
                      }
                    }
                    *(void **)(puVar9 + 2) = pvVar11;
                    *puVar9 = uVar15;
                  }
LAB_00343de7:
                  uVar1 = puVar9[1];
                  puVar9[1] = uVar1 + 1;
                  *(Vec_Int_t **)(*(long *)(puVar9 + 2) + (long)(int)uVar1 * 8) = pVVar12;
                }
                goto LAB_00343dff;
              }
              uVar16 = uVar16 + 1;
            } while (uVar1 != uVar16);
            uVar16 = (ulong)uVar1;
LAB_00343dff:
            iVar5 = (int)uVar16;
          }
          if (pVVar7->nSize <= iVar5) {
            puVar9 = (uint *)malloc(0x10);
            puVar9[0] = 8;
            puVar9[1] = 0;
            puVar10 = (undefined8 *)malloc(0x40);
            *(undefined8 **)(puVar9 + 2) = puVar10;
            puVar9[1] = 1;
            *puVar10 = pcVar6;
            iVar5 = Prs_CreateGetMemSize(__s1);
            uVar1 = *puVar9;
            if (puVar9[1] == uVar1) {
              if ((int)uVar1 < 0x10) {
                if (*(void **)(puVar9 + 2) == (void *)0x0) {
                  pvVar11 = malloc(0x80);
                }
                else {
                  pvVar11 = realloc(*(void **)(puVar9 + 2),0x80);
                }
                uVar15 = 0x10;
              }
              else {
                uVar15 = uVar1 * 2;
                if ((int)uVar15 <= (int)uVar1) goto LAB_00343ea5;
                if (*(void **)(puVar9 + 2) == (void *)0x0) {
                  pvVar11 = malloc((ulong)uVar1 << 4);
                }
                else {
                  pvVar11 = realloc(*(void **)(puVar9 + 2),(ulong)uVar1 << 4);
                }
              }
              *(void **)(puVar9 + 2) = pvVar11;
              *puVar9 = uVar15;
            }
LAB_00343ea5:
            uVar1 = puVar9[1];
            puVar9[1] = uVar1 + 1;
            *(long *)(*(long *)(puVar9 + 2) + (long)(int)uVar1 * 8) = (long)iVar5;
            if (iVar4 == 0) {
              pVVar12 = (Vec_Int_t *)malloc(0x10);
              uVar3 = Prs_BoxSignals_V._4_4_;
              lVar14 = (long)(int)Prs_BoxSignals_V._4_4_;
              pVVar12->nSize = Prs_BoxSignals_V._4_4_;
              pVVar12->nCap = uVar3;
              if (lVar14 == 0) {
                piVar13 = (int *)0x0;
              }
              else {
                piVar13 = (int *)malloc(lVar14 * 4);
              }
              pVVar12->pArray = piVar13;
              memcpy(piVar13,(void *)Prs_BoxSignals_V._8_8_,lVar14 << 2);
              Vec_IntPush(pVVar12,(int)lVar17);
              uVar1 = *puVar9;
              if (puVar9[1] == uVar1) {
                if ((int)uVar1 < 0x10) {
                  if (*(void **)(puVar9 + 2) == (void *)0x0) {
                    pvVar11 = malloc(0x80);
                  }
                  else {
                    pvVar11 = realloc(*(void **)(puVar9 + 2),0x80);
                  }
                  uVar15 = 0x10;
                }
                else {
                  uVar15 = uVar1 * 2;
                  if ((int)uVar15 <= (int)uVar1) goto LAB_00343f88;
                  if (*(void **)(puVar9 + 2) == (void *)0x0) {
                    pvVar11 = malloc((ulong)uVar1 << 4);
                  }
                  else {
                    pvVar11 = realloc(*(void **)(puVar9 + 2),(ulong)uVar1 << 4);
                  }
                }
                *(void **)(puVar9 + 2) = pvVar11;
                *puVar9 = uVar15;
              }
LAB_00343f88:
              uVar1 = puVar9[1];
              puVar9[1] = uVar1 + 1;
              *(Vec_Int_t **)(*(long *)(puVar9 + 2) + (long)(int)uVar1 * 8) = pVVar12;
            }
            uVar1 = pVVar7->nCap;
            if (pVVar7->nSize == uVar1) {
              if ((int)uVar1 < 0x10) {
                if (pVVar7->pArray == (void **)0x0) {
                  ppvVar8 = (void **)malloc(0x80);
                }
                else {
                  ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
                }
                pVVar7->pArray = ppvVar8;
                iVar4 = 0x10;
              }
              else {
                iVar4 = uVar1 * 2;
                if (iVar4 <= (int)uVar1) goto LAB_0034401a;
                if (pVVar7->pArray == (void **)0x0) {
                  ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
                }
                else {
                  ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar1 << 4);
                }
                pVVar7->pArray = ppvVar8;
              }
              pVVar7->nCap = iVar4;
            }
LAB_0034401a:
            iVar4 = pVVar7->nSize;
            pVVar7->nSize = iVar4 + 1;
            pVVar7->pArray[iVar4] = puVar9;
          }
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < (pNtk->vObjs).nSize);
  }
  return pVVar7;
}

Assistant:

Vec_Ptr_t * Prs_CreateDetectRams( Prs_Ntk_t * pNtk )
{
    Vec_Ptr_t * vAllRams = NULL, * vRam; 
    Vec_Int_t * vBox, * vBoxCopy; 
    char * pNtkName, * pRamName;
    int NameRamId = Abc_NamStrFind( pNtk->pStrs, "Ram" );
    int i, k, fWrite;
    Prs_NtkForEachBox( pNtk, vBox, i )
    {
        if ( Prs_BoxIsNode(pNtk, i) ) // node
            continue;
        pNtkName = Prs_NtkStr(pNtk, Prs_BoxNtk(pNtk, i));
        fWrite = !strncmp(pNtkName, "ClockedWritePort_", strlen("ClockedWritePort_"));
        if ( fWrite || !strncmp(pNtkName, "ReadPort_", strlen("ReadPort_")) )
        {
            pRamName = Prs_CreateDetectRamPort( pNtk, vBox, NameRamId ); assert( pRamName );
            if ( vAllRams == NULL )
                vAllRams = Vec_PtrAlloc( 4 );
            Vec_PtrForEachEntry( Vec_Ptr_t *, vAllRams, vRam, k )
                if ( pRamName == (char *)Vec_PtrEntry(vRam, 0) )
                {
                    if ( fWrite )
                    {
                        vBoxCopy = Vec_IntDup(vBox);
                        Vec_IntPush( vBoxCopy, i );
                        Vec_PtrPush( vRam, vBoxCopy );
                    }
                    break;
                }
            if ( k < Vec_PtrSize(vAllRams) )
                continue;
            vRam = Vec_PtrAlloc( 4 );
            Vec_PtrPush( vRam, pRamName );
            Vec_PtrPush( vRam, Abc_Int2Ptr(Prs_CreateGetMemSize(pNtkName)) );
            if ( fWrite )
            {
                vBoxCopy = Vec_IntDup(vBox);
                Vec_IntPush( vBoxCopy, i );
                Vec_PtrPush( vRam, vBoxCopy );
            }
            Vec_PtrPush( vAllRams, vRam );
        }
    }
    return vAllRams;
}